

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

size_t mpack_node_enum_optional(mpack_node_t node,char **strings,size_t count)

{
  uint uVar1;
  char *pcVar2;
  mpack_node_data_t *pmVar3;
  char *__s;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  mpack_node_data_t *pmVar7;
  
  pmVar7 = node.data;
  if (((node.tree)->error == mpack_ok) && (pmVar7->type == mpack_type_str)) {
    if (count == 0) {
      count = 0;
    }
    else {
      pcVar2 = (node.tree)->data;
      pmVar3 = (pmVar7->value).children;
      uVar1 = pmVar7->len;
      sVar6 = 0;
      do {
        __s = strings[sVar6];
        sVar5 = strlen(__s);
        if ((sVar5 == uVar1) && (iVar4 = bcmp(pcVar2 + (long)pmVar3,__s,(ulong)uVar1), iVar4 == 0))
        {
          return sVar6;
        }
        sVar6 = sVar6 + 1;
      } while (count != sVar6);
    }
  }
  return count;
}

Assistant:

size_t mpack_node_enum_optional(mpack_node_t node, const char* strings[], size_t count) {
    if (mpack_node_error(node) != mpack_ok)
        return count;

    // the value is only recognized if it is a string
    if (mpack_node_type(node) != mpack_type_str)
        return count;

    // fetch the string
    const char* key = mpack_node_str(node);
    size_t keylen = mpack_node_strlen(node);
    mpack_assert(mpack_node_error(node) == mpack_ok, "these should not fail");

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    return count;
}